

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

int isFuncMatch(ast *node,attr *a,char **s1,char **s2)

{
  int iVar1;
  attr *exp;
  char *__dest;
  size_t sVar2;
  ast *paVar3;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  ast *in_RDI;
  int len2;
  int len1;
  arg_t *arg2;
  arg_t *arg1;
  ast *args;
  int fun_name_len;
  char *buf2;
  char *buf1;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  long local_58;
  arg_t *local_50;
  int local_4;
  
  exp = (attr *)malloc(0x100);
  __dest = (char *)malloc(0x100);
  sVar2 = strlen(in_RDI->val->typeval);
  sprintf((char *)exp,"%s(",in_RDI->val->numval);
  strcpy(__dest,"(");
  paVar3 = sibling(in_RDI,2);
  if (paVar3->type != 0x111) {
    for (local_50 = SEM_Args((ast *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        local_50 != (arg_t *)0x0; local_50 = local_50->next) {
      isFuncMatchCpStr(exp,__dest);
      strcat(__dest,", ");
    }
  }
  for (local_58 = *(long *)(*(long *)(in_RSI + 8) + 0x10); local_58 != 0;
      local_58 = *(long *)(local_58 + 8)) {
    isFuncMatchCpStr(exp,__dest);
    strcat((char *)exp,", ");
  }
  iVar1 = strcmp((char *)((long)&exp->kind + (long)(int)sVar2),__dest);
  if (iVar1 == 0) {
    free(exp);
    free(__dest);
    local_4 = 1;
  }
  else {
    *in_RDX = exp;
    *in_RCX = __dest;
    sVar2 = strlen((char *)exp);
    iVar1 = (int)sVar2;
    sVar2 = strlen(__dest);
    if (*(char *)((long)&exp->kind + (long)(iVar1 + -1)) != '(') {
      *(undefined1 *)((long)&exp->kind + (long)(iVar1 + -2)) = 0;
    }
    if (__dest[(int)sVar2 + -1] != '(') {
      __dest[(int)sVar2 + -2] = '\0';
    }
    strcat((char *)exp,")");
    strcat(__dest,")");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int isFuncMatch(struct ast *node, struct attr *a, char **s1, char **s2) {
    char *buf1 = malloc(256), *buf2 = malloc(256);
    int fun_name_len = (int) strlen(node->val->idval);
    sprintf(buf1, "%s(", node->val->idval);
    strcpy(buf2, "(");
    struct ast *args = sibling(node, 2);
    if (args->type != RP) {
        struct arg_t *arg1 = SEM_Args(args);
        for (; arg1; arg1 = arg1->next) {
            isFuncMatchCpStr(arg1->arg, buf2);
            strcat(buf2, ", ");
        }
    }
    for (struct arg_t *arg2 = a->function->arg_list; arg2; arg2 = arg2->next) {
        isFuncMatchCpStr(arg2->arg, buf1);
        strcat(buf1, ", ");
    }
    if (strcmp(buf1 + fun_name_len, buf2) != 0) {
        *s1 = buf1;
        *s2 = buf2;
        int len1 = (int) strlen(buf1);
        int len2 = (int) strlen(buf2);
        if (buf1[len1 - 1] != '(') {
            buf1[len1 - 2] = 0;
        }
        if (buf2[len2 - 1] != '(') {
            buf2[len2 - 2] = 0;
        }
        strcat(buf1, ")");
        strcat(buf2, ")");
        return 0;
    } else {
        free(buf1);
        free(buf2);
        return 1;
    }
}